

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::rightTrim(String *this,String *b)

{
  int local_1c;
  int l;
  String *b_local;
  String *this_local;
  
  if ((b->super_tagbstring).slen != 0) {
    local_1c = invReverseFindAnyChar(this,b,(this->super_tagbstring).slen + -1);
    if (local_1c == -1) {
      local_1c = (this->super_tagbstring).slen + -1;
    }
    (this->super_tagbstring).slen = local_1c + 1;
    if ((this->super_tagbstring).slen < (this->super_tagbstring).mlen) {
      (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    }
  }
  return;
}

Assistant:

void String::rightTrim(const String& b)
    {
                if (!b.slen) return;
        int l = invReverseFindAnyChar(b, slen - 1);
        if (l == BSTR_ERR)    l = slen - 1;
        slen = l + 1;
        if (mlen > slen) data[slen] = '\0';
    }